

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

uint32_t lrtr_get_bits(uint32_t val,uint8_t from,uint8_t number)

{
  long in_FS_OFFSET;
  uint local_1c;
  uint32_t mask;
  uint8_t number_local;
  uint8_t from_local;
  uint32_t val_local;
  
  if (0x20 < number) {
    __assert_fail("number < 33",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/utils.c"
                  ,0x2c,"uint32_t lrtr_get_bits(const uint32_t, const uint8_t, const uint8_t)");
  }
  if (number != '\0') {
    local_1c = 0xffffffff;
    if (number != ' ') {
      local_1c = 0xffffffffU >> (number & 0x1f) ^ 0xffffffff;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return local_1c >> (from & 0x1f) & val;
    }
    __stack_chk_fail();
  }
  __assert_fail("number > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/lib/utils.c"
                ,0x2d,"uint32_t lrtr_get_bits(const uint32_t, const uint8_t, const uint8_t)");
}

Assistant:

uint32_t lrtr_get_bits(const uint32_t val, const uint8_t from, const uint8_t number)
{
	assert(number < 33);
	assert(number > 0);

	uint32_t mask = ~0;

	if (number != 32)
		mask = ~(mask >> number);

	mask >>= from;
	return (mask & val);
}